

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O3

bool MeCab::Connector::compile(char *ifile,char *ofile)

{
  istringstream *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *__s;
  char *pcVar7;
  ostream *poVar8;
  long *plVar9;
  char *pcVar10;
  ulong uVar11;
  char **ppcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  unsigned_short rsize;
  unsigned_short lsize;
  vector<short,_std::allocator<short>_> matrix;
  char *column [4];
  ofstream ofs;
  istringstream iss;
  ifstream ifs;
  ushort local_606;
  ushort local_604;
  die local_601;
  istringstream *local_600;
  char *local_5f8;
  vector<short,_std::allocator<short>_> local_5f0;
  char *local_5d8 [4];
  undefined1 *local_5b8;
  filebuf local_5b0 [8];
  undefined1 local_5a8 [16];
  byte abStack_598 [216];
  ios_base local_4c0 [264];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_600 = (istringstream *)local_238;
  local_5f8 = ofile;
  std::ifstream::ifstream(local_600,ifile,_S_in);
  local_5b8 = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"1 1\n0 0 0\n","");
  std::__cxx11::istringstream::istringstream(local_3b8,(string *)&local_5b8,_S_in);
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  pcVar13 = local_5f8;
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    if (ifile == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x17b498);
    }
    else {
      sVar6 = strlen(ifile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,ifile,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," is not found. minimum setting is used.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    local_600 = local_3b8;
  }
  __s = (char *)operator_new__(0x2000);
  piVar1 = local_600;
  std::ios::widen((char)*(undefined8 *)(*(long *)local_600 + -0x18) + (char)local_600);
  std::istream::getline((char *)piVar1,(long)__s,'\0');
  sVar6 = strlen(__s);
  pcVar7 = __s + sVar6;
  ppcVar12 = local_5d8;
  uVar11 = 0;
  pcVar10 = __s;
  do {
    pcVar15 = pcVar10;
    if (1 < uVar11) break;
    for (; ((pcVar14 = pcVar7, pcVar15 != pcVar7 && (pcVar14 = pcVar15, *pcVar15 != '\t')) &&
           (*pcVar15 != ' ')); pcVar15 = pcVar15 + 1) {
    }
    *pcVar14 = '\0';
    if (*pcVar10 != '\0') {
      *ppcVar12 = pcVar10;
      ppcVar12 = ppcVar12 + 1;
      uVar11 = uVar11 + 1;
    }
    pcVar10 = pcVar14 + 1;
  } while (pcVar14 != pcVar7);
  if (uVar11 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
               ,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"tokenize2(buf.get(), \"\\t \", column, 2) == 2",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar6);
    die::~die((die *)&local_5b8);
  }
  uVar2 = atoi(local_5d8[0]);
  local_604 = (ushort)uVar2;
  uVar3 = atoi(local_5d8[1]);
  local_606 = (ushort)uVar3;
  std::vector<short,_std::allocator<short>_>::vector
            (&local_5f0,(ulong)((uVar3 & 0xffff) * (uVar2 & 0xffff)),(allocator_type *)&local_5b8);
  if (local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    memset(local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start,0,
           ((long)local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_finish +
            (-2 - (long)local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start) & 0xfffffffffffffffeU) + 2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  if (ifile == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x17b2c8);
  }
  else {
    sVar6 = strlen(ifile);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,ifile,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ... ",5);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  do {
    piVar1 = local_600;
    std::ios::widen((char)*(undefined8 *)(*(long *)local_600 + -0x18) + (char)local_600);
    plVar9 = (long *)std::istream::getline((char *)piVar1,(long)__s,'\0');
    if ((*(byte *)((long)plVar9 + *(long *)(*plVar9 + -0x18) + 0x20) & 5) != 0) {
      std::ofstream::ofstream(&local_5b8,pcVar13,_S_out|_S_bin);
      if ((abStack_598[*(long *)(local_5b8 + -0x18)] & 5) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                   ,0x6f);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x68);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"ofs",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"permission denied: ",0x13);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
        }
        else {
          sVar6 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,sVar6);
        }
        die::~die(&local_601);
      }
      std::ostream::write((char *)&local_5b8,(long)&local_604);
      std::ostream::write((char *)&local_5b8,(long)&local_606);
      std::ostream::write((char *)&local_5b8,
                          (long)local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_start);
      std::ofstream::close();
      local_5b8 = _VTT;
      *(undefined8 *)(local_5b0 + *(long *)(_VTT + -0x18) + -8) = _log;
      std::filebuf::~filebuf(local_5b0);
      std::ios_base::~ios_base(local_4c0);
      if (local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      operator_delete__(__s);
      std::__cxx11::istringstream::~istringstream(local_3b8);
      std::ios_base::~ios_base(local_340);
      std::ifstream::~ifstream(local_238);
      return true;
    }
    sVar6 = strlen(__s);
    pcVar10 = __s + sVar6;
    ppcVar12 = local_5d8;
    uVar11 = 0;
    pcVar13 = __s;
    do {
      pcVar7 = pcVar13;
      if (2 < uVar11) break;
      for (; ((pcVar15 = pcVar10, pcVar7 != pcVar10 && (pcVar15 = pcVar7, *pcVar7 != '\t')) &&
             (*pcVar7 != ' ')); pcVar7 = pcVar7 + 1) {
      }
      *pcVar15 = '\0';
      if (*pcVar13 != '\0') {
        *ppcVar12 = pcVar13;
        ppcVar12 = ppcVar12 + 1;
        uVar11 = uVar11 + 1;
      }
      pcVar13 = pcVar15 + 1;
    } while (pcVar15 != pcVar10);
    if (uVar11 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"tokenize2(buf.get(), \"\\t \", column, 3) == 3",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar6);
      die::~die((die *)&local_5b8);
    }
    iVar4 = atoi(local_5d8[0]);
    uVar16 = (ulong)iVar4;
    iVar4 = atoi(local_5d8[1]);
    iVar5 = atoi(local_5d8[2]);
    uVar11 = (ulong)local_604;
    if ((uVar11 <= uVar16) || ((ulong)local_606 <= (ulong)(long)iVar4)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/connector.cpp"
                 ,0x6f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x62);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"l < lsize && r < rsize",0x16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"index values are out of range",0x1d);
      die::~die((die *)&local_5b8);
    }
    progress_bar("emitting matrix      ",uVar16 + 1,uVar11);
    local_5f0.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar11 * (long)iVar4 + uVar16] = (short)iVar5;
    pcVar13 = local_5f8;
  } while( true );
}

Assistant:

bool Connector::compile(const char *ifile, const char *ofile) {
  std::ifstream ifs(WPATH(ifile));
  std::istringstream iss(MATRIX_DEF_DEFAULT);
  std::istream *is = &ifs;

  if (!ifs) {
    std::cerr << ifile
              << " is not found. minimum setting is used." << std::endl;
    is = &iss;
  }


  char *column[4];
  scoped_fixed_array<char, BUF_SIZE> buf;

  is->getline(buf.get(), buf.size());

  CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
      << "format error: " << buf.get();

  const unsigned short lsize = std::atoi(column[0]);
  const unsigned short rsize = std::atoi(column[1]);
  std::vector<short> matrix(lsize * rsize);
  std::fill(matrix.begin(), matrix.end(), 0);

  std::cout << "reading " << ifile << " ... "
            << lsize << "x" << rsize << std::endl;

  while (is->getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t ", column, 3) == 3)
        << "format error: " << buf.get();
    const size_t l = std::atoi(column[0]);
    const size_t r = std::atoi(column[1]);
    const int    c = std::atoi(column[2]);
    CHECK_DIE(l < lsize && r < rsize) << "index values are out of range";
    progress_bar("emitting matrix      ", l + 1, lsize);
    matrix[(l + lsize * r)] = static_cast<short>(c);
  }

  std::ofstream ofs(WPATH(ofile), std::ios::binary|std::ios::out);
  CHECK_DIE(ofs) << "permission denied: " << ofile;
  ofs.write(reinterpret_cast<const char*>(&lsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&rsize), sizeof(unsigned short));
  ofs.write(reinterpret_cast<const char*>(&matrix[0]),
            lsize * rsize * sizeof(short));
  ofs.close();

  return true;
}